

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O0

Type * __thiscall
slang::ast::builtins::QueueDeleteMethod::checkArguments
          (QueueDeleteMethod *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_5)

{
  bool bVar1;
  Compilation *this_00;
  size_type sVar2;
  ASTContext *in_RCX;
  SystemSubroutine *in_RDX;
  Expression *in_R8;
  ASTContext *in_R9;
  ASTContext *unaff_retaddr;
  SystemSubroutine *in_stack_00000008;
  undefined1 in_stack_00000010 [16];
  size_t in_stack_00000030;
  Compilation *comp;
  Type *pTVar3;
  undefined8 in_stack_fffffffffffffff8;
  undefined1 isMethod;
  
  isMethod = (undefined1)((ulong)in_stack_fffffffffffffff8 >> 0x38);
  this_00 = ASTContext::getCompilation((ASTContext *)0xabde86);
  pTVar3 = (Type *)0x1;
  bVar1 = SystemSubroutine::checkArgCount
                    (in_stack_00000008,unaff_retaddr,(bool)isMethod,(Args *)in_R8,
                     (SourceRange)in_stack_00000010,in_stack_00000030,(size_t)comp);
  if (bVar1) {
    std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
              ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)in_RDX,0);
    bVar1 = SystemSubroutine::registerLValue(in_R8,in_RCX);
    if (bVar1) {
      sVar2 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::size
                        ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                         0xabdf27);
      if (1 < sVar2) {
        std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                  ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)in_RDX,1);
        not_null<const_slang::ast::Type_*>::operator->
                  ((not_null<const_slang::ast::Type_*> *)0xabdf48);
        bVar1 = Type::isIntegral(pTVar3);
        if (!bVar1) {
          std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                    ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)in_RDX,1);
          pTVar3 = SystemSubroutine::badArg(in_RDX,in_R9,(Expression *)this_00);
          return pTVar3;
        }
      }
      pTVar3 = Compilation::getVoidType(this_00);
    }
    else {
      pTVar3 = Compilation::getErrorType(this_00);
    }
  }
  else {
    pTVar3 = Compilation::getErrorType(this_00);
  }
  return pTVar3;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, true, args, range, 0, 1))
            return comp.getErrorType();

        if (!registerLValue(*args[0], context))
            return comp.getErrorType();

        if (args.size() > 1) {
            if (!args[1]->type->isIntegral())
                return badArg(context, *args[1]);
        }

        return comp.getVoidType();
    }